

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

Var * __thiscall
Js::InlinedFrameWalker::GetArgv(InlinedFrameWalker *this,bool includeThis,bool boxArgsAndDeepCopy)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  InlinedFrame *pIVar4;
  undefined4 *puVar5;
  size_t sVar6;
  Recycler *this_00;
  ulong uVar7;
  ulong uVar8;
  Var *args;
  ulong argCount;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  pIVar4 = GetFrameAtIndex(this,this->currentIndex);
  if (pIVar4 == (InlinedFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x567,"(currentFrame)","currentFrame");
    if (!bVar2) goto LAB_00afb145;
    *puVar5 = 0;
  }
  uVar8 = (ulong)includeThis ^ 1;
  data._32_8_ = pIVar4;
  sVar6 = GetArgc(this);
  if (boxArgsAndDeepCopy) {
    argCount = sVar6 - uVar8;
    local_70 = (undefined1  [8])&void*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_4f74616;
    data.filename._0_4_ = 0x572;
    data.plusSize = argCount;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((((((this->parentFunction->super_ScriptFunctionBase).
                              super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                              type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                          scriptContext.ptr)->recycler,(TrackAllocData *)local_70);
    if ((int)sVar6 == (int)uVar8) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      args = (Var *)&DAT_00000008;
    }
    else {
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00afb145;
        *puVar5 = 0;
      }
      uVar7 = -(ulong)(argCount >> 0x3d != 0) | argCount * 8;
      if (uVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                    "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
        if (!bVar2) goto LAB_00afb145;
        *puVar5 = 0;
      }
      args = (Var *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                              (this_00,uVar7);
      if (args == (Var *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
LAB_00afb145:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
    if ((int)sVar6 != (int)uVar8) {
      uVar7 = 0;
      do {
        args[uVar7] = *(Var *)(data._32_8_ + uVar8 * 8 + 0x18 + uVar7 * 8);
        uVar7 = uVar7 + 1;
      } while (argCount != uVar7);
    }
    FinalizeStackValues(this,args,argCount,true);
  }
  else {
    args = (Var *)(data._32_8_ + uVar8 * 8 + 0x18);
  }
  return args;
}

Assistant:

Js::Var *InlinedFrameWalker::GetArgv(bool includeThis, bool boxArgsAndDeepCopy) const
    {
        InlinedFrameWalker::InlinedFrame *const currentFrame = GetCurrentFrame();
        Assert(currentFrame);

        uint firstArg = includeThis ? InlinedFrameArgIndex_This : InlinedFrameArgIndex_SecondScriptArg;
        size_t argCount = this->GetArgc() - firstArg;
        Js::Var *args;
        if (!boxArgsAndDeepCopy)
        {
            args = &currentFrame->argv[firstArg];
        }
        else
        {
            args = RecyclerNewArray(parentFunction->GetScriptContext()->GetRecycler(), Js::Var, argCount);
            for (size_t i = 0; i < argCount; i++)
            {
                args[i] = currentFrame->argv[firstArg + i];
            }

            this->FinalizeStackValues(args, argCount, true /*deepCopy*/);
        }

        return args;
    }